

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

int __thiscall QTzTimeZonePrivate::offsetFromUtc(QTzTimeZonePrivate *this,qint64 atMSecsSinceEpoch)

{
  undefined4 uVar1;
  long in_FS_OFFSET;
  Data tran;
  undefined1 local_48 [40];
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  data((Data *)local_48,this,atMSecsSinceEpoch);
  uVar1 = local_48._32_4_;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QTzTimeZonePrivate::offsetFromUtc(qint64 atMSecsSinceEpoch) const
{
    const Data tran = data(atMSecsSinceEpoch);
    return tran.offsetFromUtc; // == tran.standardTimeOffset + tran.daylightTimeOffset
}